

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  Btree *pBtree;
  long lVar1;
  MemPage *pPage_00;
  uchar *pCell;
  long lVar2;
  ushort uVar3;
  int iVar4;
  uchar *pCell_00;
  sqlite3_value *psVar5;
  undefined1 local_e8 [8];
  CellInfo info_1;
  undefined1 local_c8 [4];
  Pgno ovfl;
  CellInfo info;
  BtreePayload x2;
  UnpackedRecord r;
  uchar *newCell;
  uchar *oldCell;
  Btree *p;
  MemPage *pPage;
  int idx;
  int szNew;
  int loc;
  int rc;
  int seekResult_local;
  int flags_local;
  BtreePayload *pX_local;
  BtCursor *pCur_local;
  
  pPage._4_4_ = 0;
  pBtree = pCur->pBtree;
  idx = seekResult;
  loc = seekResult;
  rc = flags;
  _seekResult_local = pX;
  pX_local = (BtreePayload *)pCur;
  if ((pCur->curFlags & 0x20) != 0) {
    szNew = saveAllCursors(pBtree->pBt,pCur->pgnoRoot,pCur);
    if (szNew != 0) {
      return szNew;
    }
    if ((idx != 0) && ((char)pX_local[1].nData < '\0')) {
      iVar4 = sqlite3CorruptError(0x13803);
      return iVar4;
    }
    szNew = 0;
  }
  if (((2 < *(byte *)&pX_local->pKey) && (szNew = moveToRoot((BtCursor *)pX_local), szNew != 0)) &&
     (szNew != 0x10)) {
    return szNew;
  }
  lVar1._0_2_ = pX_local[2].nMem;
  lVar1._2_2_ = *(undefined2 *)&pX_local[2].field_0x22;
  lVar1._4_4_ = pX_local[2].nData;
  if (lVar1 == 0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,*(Pgno *)&pX_local[1].nMem,_seekResult_local->nKey,0);
    }
    if ((((ulong)pX_local->pKey & 0x200) == 0) ||
       ((void *)_seekResult_local->nKey != pX_local[1].pKey)) {
      if (idx == 0) {
        iVar4 = sqlite3BtreeTableMoveto
                          ((BtCursor *)pX_local,_seekResult_local->nKey,(uint)((rc & 8U) != 0),&idx)
        ;
        if (iVar4 != 0) {
          return iVar4;
        }
        szNew = 0;
      }
    }
    else if ((*(short *)((long)&pX_local[1].pData + 6) != 0) &&
            (*(int *)&pX_local[1].pData == _seekResult_local->nData + _seekResult_local->nZero)) {
      iVar4 = btreeOverwriteCell((BtCursor *)pX_local,_seekResult_local);
      return iVar4;
    }
  }
  else {
    if ((idx == 0) && ((rc & 2U) == 0)) {
      if (_seekResult_local->nMem == 0) {
        szNew = btreeMoveto((BtCursor *)pX_local,_seekResult_local->pKey,_seekResult_local->nKey,
                            (uint)((rc & 8U) != 0),&idx);
      }
      else {
        x2._40_8_ = *(undefined8 *)&pX_local[2].nMem;
        szNew = sqlite3BtreeIndexMoveto((BtCursor *)pX_local,(UnpackedRecord *)&x2.nZero,&idx);
      }
      if (szNew != 0) {
        return szNew;
      }
    }
    if ((idx == 0) &&
       (getCellInfo((BtCursor *)pX_local), pX_local[1].pKey == (void *)_seekResult_local->nKey)) {
      x2.nKey = (sqlite3_int64)_seekResult_local->pKey;
      x2.aMem._4_4_ = (undefined4)_seekResult_local->nKey;
      x2.nMem = 0;
      x2._34_2_ = 0;
      iVar4 = btreeOverwriteCell((BtCursor *)pX_local,(BtreePayload *)&info.nPayload);
      return iVar4;
    }
  }
  pPage_00 = *(MemPage **)&pX_local[2].nZero;
  if (pPage_00->nFree < 0) {
    if (*(byte *)&pX_local->pKey < 2) {
      szNew = btreeComputeFreeSpace(pPage_00);
    }
    else {
      szNew = sqlite3CorruptError(0x1387e);
    }
    if (szNew != 0) {
      return szNew;
    }
  }
  pCell = pBtree->pBt->pTmpSpace;
  if ((rc & 0x80U) == 0) {
    iVar4 = fillInCell(pPage_00,pCell,_seekResult_local,(int *)((long)&pPage + 4));
    if (iVar4 != 0) {
      return iVar4;
    }
    szNew = 0;
  }
  else {
    szNew = 0;
    pPage._4_4_ = pBtree->pBt->nPreformatSize;
    if ((int)pPage._4_4_ < 4) {
      pPage._4_4_ = 4;
      pCell[3] = '\0';
    }
    if (((pBtree->pBt->autoVacuum != '\0') && ((int)(uint)pPage_00->maxLocal < (int)pPage._4_4_)) &&
       ((*pPage_00->xParseCell)(pPage_00,pCell,(CellInfo *)local_c8),
       (uint)info.pPayload != info.pPayload._4_2_)) {
      info_1._20_4_ = sqlite3Get4byte(pCell + (int)(pPage._4_4_ - 4));
      ptrmapPut(pBtree->pBt,info_1._20_4_,'\x03',pPage_00->pgno,&szNew);
      if (szNew != 0) {
        return szNew;
      }
    }
  }
  pPage._0_4_ = (uint)*(ushort *)((long)&pX_local[1].nData + 2);
  *(undefined2 *)((long)&pX_local[1].pData + 6) = 0;
  if (idx == 0) {
    if (pPage_00->nCell <= (uint)pPage) {
      iVar4 = sqlite3CorruptError(0x138a8);
      return iVar4;
    }
    szNew = sqlite3PagerWrite(pPage_00->pDbPage);
    if (szNew != 0) {
      return szNew;
    }
    pCell_00 = pPage_00->aData +
               (int)(uint)(pPage_00->maskPage &
                          CONCAT11(pPage_00->aCellIdx[(int)((uint)pPage << 1)],
                                   pPage_00->aCellIdx[(long)(int)((uint)pPage << 1) + 1]));
    if (pPage_00->leaf == '\0') {
      *(undefined4 *)pCell = *(undefined4 *)pCell_00;
    }
    (*pPage_00->xParseCell)(pPage_00,pCell_00,(CellInfo *)local_e8);
    if (info_1.pPayload._4_2_ == (uint)info_1.pPayload) {
      szNew = 0;
    }
    else {
      szNew = clearCellOverflow(pPage_00,pCell_00,(CellInfo *)local_e8);
    }
    *(byte *)((long)&pX_local->pKey + 1) = *(byte *)((long)&pX_local->pKey + 1) & 0xfb;
    if (((info_1.pPayload._6_2_ == pPage._4_4_) && (info_1.pPayload._4_2_ == (uint)info_1.pPayload))
       && ((pBtree->pBt->autoVacuum == '\0' || ((int)pPage._4_4_ < (int)(uint)pPage_00->minLocal))))
    {
      if (pCell_00 < pPage_00->aData + (long)(int)(uint)pPage_00->hdrOffset + 10) {
        iVar4 = sqlite3CorruptError(0x138c3);
        return iVar4;
      }
      if (pCell_00 + (int)pPage._4_4_ <= pPage_00->aDataEnd) {
        memcpy(pCell_00,pCell,(long)(int)pPage._4_4_);
        return 0;
      }
      iVar4 = sqlite3CorruptError(0x138c6);
      return iVar4;
    }
    dropCell(pPage_00,(uint)pPage,(uint)info_1.pPayload._6_2_,&szNew);
    if (szNew != 0) {
      return szNew;
    }
  }
  else if ((idx < 0) && (pPage_00->nCell != 0)) {
    uVar3 = *(short *)((long)&pX_local[1].nData + 2) + 1;
    *(ushort *)((long)&pX_local[1].nData + 2) = uVar3;
    pPage._0_4_ = (uint)uVar3;
    *(byte *)((long)&pX_local->pKey + 1) = *(byte *)((long)&pX_local->pKey + 1) & 0xf9;
  }
  szNew = insertCellFast(pPage_00,(uint)pPage,pCell,pPage._4_4_);
  if (pPage_00->nOverflow != '\0') {
    *(byte *)((long)&pX_local->pKey + 1) = *(byte *)((long)&pX_local->pKey + 1) & 0xf9;
    szNew = balance((BtCursor *)pX_local);
    *(undefined1 *)(*(long *)&pX_local[2].nZero + 0xc) = 0;
    *(undefined1 *)&pX_local->pKey = 1;
    if (((rc & 2U) != 0) && (szNew == 0)) {
      btreeReleaseAllCursorPages((BtCursor *)pX_local);
      lVar2._0_2_ = pX_local[2].nMem;
      lVar2._2_2_ = *(undefined2 *)&pX_local[2].field_0x22;
      lVar2._4_4_ = pX_local[2].nData;
      if (lVar2 != 0) {
        psVar5 = (sqlite3_value *)sqlite3Malloc(_seekResult_local->nKey);
        pX_local->aMem = psVar5;
        if (pX_local->aMem == (sqlite3_value *)0x0) {
          szNew = 7;
        }
        else {
          memcpy(pX_local->aMem,_seekResult_local->pKey,_seekResult_local->nKey);
        }
      }
      *(undefined1 *)&pX_local->pKey = 3;
      pX_local[1].aMem = (sqlite3_value *)_seekResult_local->nKey;
    }
  }
  return szNew;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}